

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_noise_table.c
# Opt level: O1

void GenerateLumaGrainBlock
               (RK_S32 (*luma_grain_block) [82],RK_S32 bitdepth,RK_U8 num_y_points,
               RK_S32 grain_scale_shift,RK_S32 ar_coeff_lag,RK_S32 *ar_coeffs_y,
               RK_S32 ar_coeff_shift,RK_S32 grain_min,RK_S32 grain_max,RK_U16 random_seed)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  RK_S32 RVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  RK_S32 a;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  RK_S32 (*paRVar14) [82];
  long lVar15;
  long local_50;
  
  uVar7 = (uint)random_seed;
  cVar1 = (char)grain_scale_shift - (char)bitdepth;
  lVar2 = 0;
  paRVar14 = luma_grain_block;
  do {
    lVar15 = 0;
    do {
      if (num_y_points == '\0') {
        iVar10 = 0;
      }
      else {
        uVar7 = uVar7 & 0xffff;
        uVar7 = (uVar7 ^ uVar7 >> 1 ^ uVar7 >> 0xc ^ uVar7 >> 3) << 0xf | uVar7 >> 1;
        iVar10 = *(int *)((long)gaussian_sequence + (ulong)(uVar7 >> 3 & 0x1ffc)) +
                 (1 << (cVar1 + 0xbU & 0x1f)) >> (cVar1 + 0xcU & 0x1f);
      }
      (*paRVar14)[lVar15] = iVar10;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x52);
    lVar2 = lVar2 + 1;
    paRVar14 = paRVar14 + 1;
  } while (lVar2 != 0x49);
  lVar2 = (long)-ar_coeff_lag;
  lVar15 = (long)luma_grain_block + lVar2 * 0x14c + 0x3e4;
  local_50 = 3;
  do {
    lVar9 = 3;
    lVar13 = lVar15;
    do {
      iVar10 = 0;
      if (-1 < ar_coeff_lag) {
        iVar12 = 0;
        lVar6 = lVar13;
        lVar8 = lVar2;
        do {
          if ((-1 < ar_coeff_lag) && ((int)lVar8 != 0 || -ar_coeff_lag != 0)) {
            lVar3 = (long)iVar12;
            lVar11 = 0;
            lVar4 = lVar2;
            do {
              iVar10 = *(int *)(lVar6 + lVar11) * *(int *)((long)ar_coeffs_y + lVar11 + lVar3 * 4) +
                       iVar10;
              iVar12 = iVar12 + 1;
              if (ar_coeff_lag <= lVar4) break;
              lVar4 = lVar4 + 1;
              lVar11 = lVar11 + 4;
            } while ((int)lVar4 != 0 || (int)lVar8 != 0);
          }
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x148;
        } while ((int)lVar8 != 1);
      }
      iVar10 = (iVar10 + (1 << ((byte)ar_coeff_shift - 1 & 0x1f)) >> ((byte)ar_coeff_shift & 0x1f))
               + luma_grain_block[local_50][lVar9];
      RVar5 = grain_max;
      if (iVar10 < grain_max) {
        RVar5 = iVar10;
      }
      if (iVar10 < grain_min) {
        RVar5 = grain_min;
      }
      luma_grain_block[local_50][lVar9] = RVar5;
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 4;
    } while (lVar9 != 0x4f);
    local_50 = local_50 + 1;
    lVar15 = lVar15 + 0x148;
    if (local_50 == 0x49) {
      return;
    }
  } while( true );
}

Assistant:

void GenerateLumaGrainBlock(RK_S32 luma_grain_block[][82], RK_S32 bitdepth,
                            RK_U8 num_y_points, RK_S32 grain_scale_shift,
                            RK_S32 ar_coeff_lag, RK_S32 ar_coeffs_y[],
                            RK_S32 ar_coeff_shift, RK_S32 grain_min, RK_S32 grain_max,
                            RK_U16 random_seed)
{
    RK_S32 gauss_sec_shift = 12 - bitdepth + grain_scale_shift;
    RK_U16 grain_random_register = random_seed;
    RK_S32 i, j;
    for (i = 0; i < 73; i++) {
        for (j = 0; j < 82; j++) {
            if (num_y_points > 0) {
                UpdateRandomRegister(&grain_random_register);
                luma_grain_block[i][j] = RoundPowerOfTwo(
                                             gaussian_sequence[GetRandomNumber(grain_random_register)],
                                             gauss_sec_shift);
            } else {
                luma_grain_block[i][j] = 0;
            }
        }
    }

    for (i = 3; i < 73; i++)
        for (j = 3; j < 82 - 3; j++) {
            RK_S32 pos = 0;
            RK_S32 wsum = 0;
            RK_S32 deltaRow, deltaCol;
            for (deltaRow = -ar_coeff_lag; deltaRow <= 0; deltaRow++) {
                for (deltaCol = -ar_coeff_lag; deltaCol <= ar_coeff_lag;
                     deltaCol++) {
                    if (deltaRow == 0 && deltaCol == 0) break;
                    wsum = wsum + ar_coeffs_y[pos] *
                           luma_grain_block[i + deltaRow][j + deltaCol];
                    ++pos;
                }
            }
            luma_grain_block[i][j] =
                Clamp(luma_grain_block[i][j] + RoundPowerOfTwo(wsum, ar_coeff_shift),
                      grain_min, grain_max);
        }
}